

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O2

void mpp_dec_put_frame(Mpp *mpp,RK_S32 index,HalDecTaskFlag flags)

{
  spinlock_t *lock;
  MppDec ctx;
  MppBufSlots pvVar1;
  long *p;
  long lVar2;
  long *plVar3;
  HalTaskGroup pvVar4;
  pthread_mutex_t *__mutex;
  ulong uVar5;
  Mpp *pMVar6;
  RK_U32 RVar7;
  MPP_RET MVar8;
  RK_S32 RVar9;
  RK_U32 RVar10;
  uint uVar11;
  int iVar12;
  RK_S64 RVar13;
  MppBuffer pvVar14;
  MppFrame frame;
  MppDecVprocCtx *local_e8;
  HalTaskHnd hnd;
  int local_d4;
  HalDecTaskFlag local_d0;
  MppBufSlots local_c8;
  Mpp *local_c0;
  MppBuffer buffer;
  MppDecVprocCfg cfg;
  
  ctx = mpp->mDec;
  pvVar1 = *(MppBufSlots *)((long)ctx + 0x30);
  frame = (MppFrame)0x0;
  uVar5 = flags.val >> 1;
  local_d0 = flags;
  local_c0 = mpp;
  if (index < 0) {
    if ((((flags.val & 1) == 0) &&
        (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"eos",
                    "mpp_dec_put_frame",0x101), (mpp_debug._3_1_ & 0x10) != 0)) ||
       (((uVar5 & 1) != 0 &&
        (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"!change",
                    "mpp_dec_put_frame",0x102), (mpp_debug._3_1_ & 0x10) != 0)))) goto LAB_00148da8;
    if (*(long *)((long)ctx + 0x218) != 0) {
      pvVar4 = *(HalTaskGroup *)((long)ctx + 0x80);
      hnd = (HalTaskHnd)0x0;
      while (MVar8 = hal_task_get_hnd(pvVar4,0,&hnd), MVar8 != MPP_OK) {
        if (*(int *)((long)ctx + 0x1a8) != 0) {
          return;
        }
        usleep(10000);
      }
      cfg.mpp = (void *)(CONCAT44(index,(int)local_d0.val) & 0xffffffff00000001);
      goto LAB_00148d45;
    }
    local_c8 = pvVar1;
    mpp_frame_init(&frame);
    mpp_frame_set_eos(frame,(uint)flags.val & 1);
    RVar9 = 0;
  }
  else {
    local_c8 = pvVar1;
    mpp_buf_slot_get_prop(pvVar1,index,SLOT_FRAME_PTR,&frame);
    RVar7 = mpp_frame_get_mode(frame);
    RVar9 = index;
    if (((RVar7 != 0) && (*(int *)((long)ctx + 0x204) != 0)) && (*(long *)((long)ctx + 0x218) == 0))
    {
      local_e8 = (MppDecVprocCtx *)((long)ctx + 0x218);
      cfg.mpp = local_c0;
      cfg.task_group = (HalTaskGroup)0x0;
      MVar8 = dec_vproc_init(local_e8,&cfg);
      if (MVar8 == MPP_OK) {
        RVar10 = dec_vproc_get_version(*local_e8);
        if ((RVar7 == 0xc) && (RVar10 == 1)) {
          mpp_frame_set_mode(frame,0);
          uVar11 = *(uint *)((long)ctx + 0xbc) & 0xfffffffd;
          *(uint *)((long)ctx + 0xbc) = uVar11;
          *(uint *)((long)ctx + 0x204) = uVar11;
          if (uVar11 == 0 && *(MppDecVprocCtx *)((long)ctx + 0x218) != (MppDecVprocCtx)0x0) {
            dec_vproc_deinit(*(MppDecVprocCtx *)((long)ctx + 0x218));
          }
          *local_e8 = (MppDecVprocCtx)0x0;
        }
        else {
          dec_vproc_set_mode(*(MppDecVprocCtx *)((long)ctx + 0x218),
                             *(MppVprocMode *)((long)ctx + 0x204));
          *(HalTaskGroup *)((long)ctx + 0x80) = cfg.task_group;
          dec_vproc_start(*(MppDecVprocCtx *)((long)ctx + 0x218));
        }
      }
      else {
        *(undefined4 *)((long)ctx + 0x204) = 0;
        *(undefined8 *)((long)ctx + 0x218) = 0;
      }
    }
  }
  local_e8 = (MppDecVprocCtx *)CONCAT44(local_e8._4_4_,RVar9);
  if ((frame != (MppFrame)0x0) ||
     (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"frame",
                 "mpp_dec_put_frame",0x128), (mpp_debug._3_1_ & 0x10) == 0)) {
    if ((*(int *)((long)ctx + 0xb8) != 0) && (*(int *)((long)ctx + 0xdc) != 0)) {
      mpp_frame_set_errinfo(frame,0);
      mpp_frame_set_discard(frame,0);
    }
    if (((uVar5 & 1) == 0) && (*(int *)((long)ctx + 0xb4) != 0)) {
      lock = (spinlock_t *)((long)ctx + 0x2a8);
      local_d4 = index;
      mpp_spinlock_lock(lock);
      p = *(long **)((long)ctx + 0x298);
      if (p == (long *)0x0 || p == (long *)((long)ctx + 0x298)) {
        mpp_spinlock_unlock(lock);
        index = local_d4;
      }
      else {
        lVar2 = *p;
        plVar3 = (long *)p[1];
        *(long **)(lVar2 + 8) = plVar3;
        *plVar3 = lVar2;
        *p = (long)p;
        p[1] = (long)p;
        mpp_spinlock_unlock(lock);
        mpp_frame_set_dts(frame,p[3]);
        mpp_frame_set_pts(frame,p[2]);
        mpp_mem_pool_put_f("mpp_dec_put_frame",*(MppMemPool *)((long)ctx + 0x290),p);
        index = local_d4;
      }
    }
    mpp_frame_set_info_change(frame,(uint)(uVar5 & 0x7fffffff) & 1);
    if (((flags.val & 1) != 0) && (mpp_frame_set_eos(frame,1), (local_d0.val & 0xc) != 0)) {
      if ((local_d0.val & 0x10) == 0) {
        mpp_frame_set_discard(frame,1);
      }
      else {
        mpp_frame_set_errinfo(frame,1);
      }
    }
    *(int *)((long)ctx + 0x288) = *(int *)((long)ctx + 0x288) + 1;
    if (((byte)mpp_dec_debug & 0x20) != 0) {
      RVar13 = mpp_frame_get_pts(frame);
      pvVar14 = mpp_frame_get_buffer(frame);
      if (pvVar14 == (MppBuffer)0x0) {
        iVar12 = -1;
      }
      else {
        pvVar14 = mpp_frame_get_buffer(frame);
        iVar12 = mpp_buffer_get_fd_with_caller(pvVar14,"mpp_dec_put_frame");
      }
      _mpp_log_l(4,"mpp_dec","detail: %p put frm pts %llu fd %d\n","mpp_dec_put_frame",ctx,RVar13,
                 iVar12);
    }
    pMVar6 = local_c0;
    if (*(long *)((long)ctx + 0x218) == 0) {
      __mutex = (pthread_mutex_t *)local_c0->mFrmOut;
      cfg.mpp = (void *)0x0;
      mpp_frame_init(&cfg.mpp);
      mpp_frame_copy(cfg.mpp,frame);
      if (((byte)mpp_debug & 2) != 0) {
        RVar13 = mpp_frame_get_pts(cfg.mpp);
        _mpp_log_l(4,"mpp_dec","output frame pts %lld\n",(char *)0x0,RVar13);
      }
      pthread_mutex_lock(__mutex);
      mpp_list::add_at_tail((mpp_list *)&__mutex->__data,&cfg,8);
      pMVar6->mFramePutCount = pMVar6->mFramePutCount + 1;
      pthread_cond_signal((pthread_cond_t *)(__mutex + 1));
      pthread_mutex_unlock(__mutex);
      if (index < 0) {
        mpp_frame_deinit(&frame);
      }
      mpp_dec_callback(ctx,MPP_DEC_EVENT_ON_FRM_READY,cfg.mpp);
      return;
    }
    pvVar4 = *(HalTaskGroup *)((long)ctx + 0x80);
    hnd = (HalTaskHnd)0x0;
    while( true ) {
      MVar8 = hal_task_get_hnd(pvVar4,0,&hnd);
      pvVar1 = local_c8;
      RVar9 = (RK_S32)local_e8;
      if (MVar8 == MPP_OK) break;
      if (*(int *)((long)ctx + 0x1a8) != 0) {
        buffer = (MppBuffer)0x0;
        mpp_buf_slot_get_prop(local_c8,(RK_S32)local_e8,SLOT_BUFFER,&buffer);
        if (buffer == (MppBuffer)0x0) {
          return;
        }
        mpp_buffer_put_with_caller(buffer,"mpp_dec_put_frame");
        return;
      }
      usleep(10000);
    }
    cfg.mpp = (void *)CONCAT71(cfg.mpp._1_7_,
                               (char)(uVar5 & 0x7fffffff) * '\x02' & 2U | (byte)local_d0.val & 1);
    cfg.mpp = (void *)CONCAT44((RK_S32)local_e8,cfg.mpp._0_4_);
    if ((uVar5 & 1) == 0) {
      mpp_buf_slot_set_flag(local_c8,(RK_S32)local_e8,SLOT_QUEUE_USE);
      mpp_buf_slot_enqueue(pvVar1,RVar9,QUEUE_DEINTERLACE);
    }
LAB_00148d45:
    hal_task_hnd_set_info(hnd,&cfg);
    hal_task_hnd_set_status(hnd,1);
    dec_vproc_signal(*(MppDecVprocCtx *)((long)ctx + 0x218));
    return;
  }
LAB_00148da8:
  abort();
}

Assistant:

void mpp_dec_put_frame(Mpp *mpp, RK_S32 index, HalDecTaskFlag flags)
{
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppBufSlots slots = dec->frame_slots;
    MppFrame frame = NULL;
    RK_U32 eos = flags.eos;
    RK_U32 change = flags.info_change;
    RK_U32 error = flags.parse_err || flags.ref_err;
    RK_U32 refer = flags.used_for_ref;
    RK_U32 fake_frame = 0;

    if (index >= 0) {
        RK_U32 mode = 0;

        mpp_buf_slot_get_prop(slots, index, SLOT_FRAME_PTR, &frame);

        mode = mpp_frame_get_mode(frame);
        if (mode && dec->enable_deinterlace && NULL == dec->vproc) {
            MppDecVprocCfg cfg = { mpp, NULL };
            MPP_RET ret = dec_vproc_init(&dec->vproc, &cfg);
            if (ret) {
                // When iep is failed to open disable deinterlace function to
                // avoid noisy log.
                dec->enable_deinterlace = 0;
                dec->vproc = NULL;
            } else {
                if (dec_vproc_get_version(dec->vproc) == 1 && mode == MPP_FRAME_FLAG_DEINTERLACED) {
                    mpp_frame_set_mode(frame, MPP_FRAME_FLAG_FRAME);
                    /*iep 1 can't no detect DEINTERLACED, direct disable*/
                    dec->cfg.base.enable_vproc &= (~MPP_VPROC_MODE_DETECTION);
                    dec->enable_deinterlace = dec->cfg.base.enable_vproc;
                    if (dec->vproc && !dec->enable_deinterlace) {
                        dec_vproc_deinit(dec->vproc);
                        dec->vproc = NULL;
                    }
                    dec->vproc = NULL;
                } else {
                    /* store current IEP mode */
                    dec_vproc_set_mode(dec->vproc, (MppVprocMode)dec->enable_deinterlace);

                    dec->vproc_tasks = cfg.task_group;
                    dec_vproc_start(dec->vproc);
                }
            }
        }
    } else {
        // when post-process is needed and eos without slot index case
        // we need to create a slot index for it
        mpp_assert(eos);
        mpp_assert(!change);

        if (dec->vproc) {
            HalTaskGroup group = dec->vproc_tasks;
            HalTaskHnd hnd = NULL;
            HalTaskInfo task;
            HalDecVprocTask *vproc_task = &task.dec_vproc;
            MPP_RET ret = MPP_OK;

            do {
                ret = hal_task_get_hnd(group, TASK_IDLE, &hnd);
                if (ret) {
                    if (dec->reset_flag) {
                        return;
                    } else {
                        msleep(10);
                    }
                }
            } while (ret);
            vproc_task->flags.val = 0;
            vproc_task->flags.eos = eos;
            vproc_task->input = index;

            hal_task_hnd_set_info(hnd, &task);
            hal_task_hnd_set_status(hnd, TASK_PROCESSING);
            dec_vproc_signal(dec->vproc);

            return ;
        } else {
            mpp_frame_init(&frame);
            fake_frame = 1;
            index = 0;
        }

        mpp_frame_set_eos(frame, eos);
    }

    mpp_assert(index >= 0);
    mpp_assert(frame);

    if (dec->cfg.base.disable_error && dec->cfg.base.dis_err_clr_mark) {
        mpp_frame_set_errinfo(frame, 0);
        mpp_frame_set_discard(frame, 0);
    }

    if (!change) {
        if (dec->cfg.base.sort_pts) {
            MppPktTs *pkt_ts;

            mpp_spinlock_lock(&dec->ts_lock);
            pkt_ts = list_first_entry_or_null(&dec->ts_link, MppPktTs, link);
            if (pkt_ts)
                list_del_init(&pkt_ts->link);
            mpp_spinlock_unlock(&dec->ts_lock);
            if (pkt_ts) {
                mpp_frame_set_dts(frame, pkt_ts->dts);
                mpp_frame_set_pts(frame, pkt_ts->pts);
                mpp_mem_pool_put(dec->ts_pool, pkt_ts);
            }
        }
    }
    mpp_frame_set_info_change(frame, change);

    if (eos) {
        mpp_frame_set_eos(frame, 1);
        if (error) {
            if (refer)
                mpp_frame_set_errinfo(frame, 1);
            else
                mpp_frame_set_discard(frame, 1);
        }
    }

    dec->dec_out_frame_count++;
    dec_dbg_detail("detail: %p put frm pts %llu fd %d\n", dec,
                   mpp_frame_get_pts(frame),
                   (NULL == mpp_frame_get_buffer(frame)) ? (-1) :
                   mpp_buffer_get_fd(mpp_frame_get_buffer(frame)));

    if (dec->vproc) {
        HalTaskGroup group = dec->vproc_tasks;
        HalTaskHnd hnd = NULL;
        HalTaskInfo task;
        HalDecVprocTask *vproc_task = &task.dec_vproc;
        MPP_RET ret = MPP_OK;

        do {
            ret = hal_task_get_hnd(group, TASK_IDLE, &hnd);
            if (ret) {
                if (dec->reset_flag) {
                    MppBuffer buffer = NULL;
                    mpp_buf_slot_get_prop(slots, index, SLOT_BUFFER, &buffer);
                    if (buffer)
                        mpp_buffer_put(buffer);
                    return;
                } else {
                    msleep(10);
                }
            }
        } while (ret);

        mpp_assert(ret == MPP_OK);

        vproc_task->flags.eos = eos;
        vproc_task->flags.info_change = change;
        vproc_task->input = index;

        if (!change) {
            mpp_buf_slot_set_flag(slots, index, SLOT_QUEUE_USE);
            mpp_buf_slot_enqueue(slots, index, QUEUE_DEINTERLACE);
        }

        hal_task_hnd_set_info(hnd, &task);
        hal_task_hnd_set_status(hnd, TASK_PROCESSING);

        dec_vproc_signal(dec->vproc);
    } else {
        // direct output -> copy a new MppFrame and output
        mpp_list *list = mpp->mFrmOut;
        MppFrame out = NULL;

        mpp_frame_init(&out);
        mpp_frame_copy(out, frame);

        mpp_dbg_pts("output frame pts %lld\n", mpp_frame_get_pts(out));

        list->lock();
        list->add_at_tail(&out, sizeof(out));
        mpp->mFramePutCount++;
        list->signal();
        list->unlock();

        if (fake_frame)
            mpp_frame_deinit(&frame);

        mpp_dec_callback(dec, MPP_DEC_EVENT_ON_FRM_READY, out);
    }
}